

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

uint32 lzham::lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)

{
  long lVar1;
  uint32 uVar2;
  
  if (p == (lzham_decompress_state_ptr)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(uint32 *)((long)p + 0x548);
    lVar1 = *(long *)((long)p + 0x538);
    if ((lVar1 != 0) && ((*(uint *)(lVar1 + -8) ^ *(uint *)(lVar1 + -4)) == 0xffffffff)) {
      lzham_free((void *)(lVar1 + -0x10));
    }
    lzham_decompressor::~lzham_decompressor((lzham_decompressor *)p);
    lzham_free(p);
  }
  return uVar2;
}

Assistant:

uint32 lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);
      if (!pState)
         return 0;

      uint32 adler32 = pState->m_decomp_adler32;

      lzham_delete_array(pState->m_pRaw_decomp_buf);
      lzham_delete(pState);

      return adler32;
   }